

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::api::anon_unknown_1::DescriptorSetLayout::create
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  bool bVar1;
  size_type sVar2;
  const_reference local_68;
  undefined1 local_48 [8];
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  Parameters *param_2_local;
  Resources *res_local;
  Environment *env_local;
  
  local_48._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  descriptorSetLayoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetLayoutInfo._4_4_ = 0;
  descriptorSetLayoutInfo.pNext._0_4_ = 0;
  descriptorSetLayoutInfo.pBindings = (VkDescriptorSetLayoutBinding *)param_3;
  sVar2 = std::
          vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ::size(&res->bindings);
  descriptorSetLayoutInfo.pNext._4_4_ = (undefined4)sVar2;
  bVar1 = std::
          vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ::empty(&res->bindings);
  if (bVar1) {
    local_68 = (const_reference)0x0;
  }
  else {
    local_68 = std::
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ::operator[](&res->bindings,0);
  }
  descriptorSetLayoutInfo._16_8_ = local_68;
  ::vk::createDescriptorSetLayout
            (__return_storage_ptr__,env->vkd,env->device,(VkDescriptorSetLayoutCreateInfo *)local_48
             ,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorSetLayout> create (const Environment& env, const Resources& res, const Parameters&)
	{
		const VkDescriptorSetLayoutCreateInfo	descriptorSetLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0,
			(deUint32)res.bindings.size(),
			(res.bindings.empty() ? DE_NULL : &res.bindings[0])
		};

		return createDescriptorSetLayout(env.vkd, env.device, &descriptorSetLayoutInfo, env.allocationCallbacks);
	}